

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.h
# Opt level: O0

void __thiscall
Liby::BinaryHeap<Liby::WeakTimerHolder>::insert
          (BinaryHeap<Liby::WeakTimerHolder> *this,const_reference_type x)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  reference this_00;
  bool local_39;
  uint local_1c;
  size_type_conflict hole;
  const_reference_type x_local;
  BinaryHeap<Liby::WeakTimerHolder> *this_local;
  
  uVar1 = this->size_;
  sVar2 = std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::size
                    (&this->heap);
  if ((ulong)uVar1 == sVar2 - 1) {
    sVar2 = std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::size
                      (&this->heap);
    std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::resize
              (&this->heap,sVar2 << 1);
  }
  local_1c = this->size_ + 1;
  this->size_ = local_1c;
  while( true ) {
    local_39 = false;
    if (1 < local_1c) {
      pvVar3 = std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::
               operator[](&this->heap,(ulong)(local_1c >> 1));
      local_39 = operator<(x,pvVar3);
    }
    if (local_39 == false) break;
    pvVar3 = std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::operator[]
                       (&this->heap,(ulong)(local_1c >> 1));
    this_00 = std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::operator[]
                        (&this->heap,(ulong)local_1c);
    WeakTimerHolder::operator=(this_00,pvVar3);
    local_1c = local_1c >> 1;
  }
  pvVar3 = std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::operator[]
                     (&this->heap,(ulong)local_1c);
  WeakTimerHolder::operator=(pvVar3,x);
  return;
}

Assistant:

void insert(const_reference_type x) {
        if (size_ == heap.size() - 1)
            heap.resize(heap.size() * 2);

        size_type hole = ++size_;
        for (; hole > 1 && x < heap[hole / 2]; hole /= 2)
            heap[hole] = heap[hole / 2];
        heap[hole] = x;
    }